

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileInstaller.cxx
# Opt level: O3

void __thiscall
cmFileInstaller::ReportCopy(cmFileInstaller *this,string *toFile,Type type,bool copy)

{
  char *pcVar1;
  string message;
  string local_48;
  
  if (this->MessageNever == false) {
    if (copy) {
      pcVar1 = "Installing: ";
    }
    else {
      if (this->MessageLazy != false) goto LAB_002db3b9;
      pcVar1 = "Up-to-date: ";
    }
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,pcVar1,pcVar1 + 0xc);
    std::__cxx11::string::_M_append((char *)&local_48,(ulong)(toFile->_M_dataplus)._M_p);
    cmMakefile::DisplayStatus((this->super_cmFileCopier).Makefile,&local_48,-1.0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
LAB_002db3b9:
  if (type != TypeDir) {
    ManifestAppend(this,toFile);
  }
  return;
}

Assistant:

void cmFileInstaller::ReportCopy(const std::string& toFile, Type type,
                                 bool copy)
{
  if (!this->MessageNever && (copy || !this->MessageLazy)) {
    std::string message = (copy ? "Installing: " : "Up-to-date: ");
    message += toFile;
    this->Makefile->DisplayStatus(message, -1);
  }
  if (type != TypeDir) {
    // Add the file to the manifest.
    this->ManifestAppend(toFile);
  }
}